

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

void __thiscall
cmsys::SystemInformationImplementation::RunCPUCheck(SystemInformationImplementation *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  double dVar4;
  _Alloc_hider _Var5;
  SystemInformationImplementation *pSVar6;
  int iVar7;
  int iVar8;
  FILE *__stream;
  long lVar9;
  ulonglong uVar10;
  long *plVar11;
  long *plVar12;
  char cVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  string sStack_388;
  undefined1 *puStack_368;
  long lStack_360;
  undefined1 uStack_358;
  undefined7 uStack_357;
  char **ppcStack_348;
  iterator iStack_340;
  char **ppcStack_338;
  string sStack_330;
  SystemInformationImplementation *pSStack_310;
  string sStack_308;
  string sStack_2e8;
  string sStack_2c8;
  long *plStack_2a8;
  long lStack_2a0;
  long lStack_298;
  long lStack_290;
  FILE *pFStack_288;
  string sStack_280;
  string sStack_260;
  string sStack_240;
  string sStack_220;
  string sStack_200;
  string sStack_1e0;
  string sStack_1c0;
  string sStack_1a0;
  string sStack_180;
  string sStack_160;
  string sStack_140;
  string sStack_120;
  string sStack_100;
  string sStack_e0;
  string sStack_c0;
  string sStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_60;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  puStack_368 = &uStack_358;
  lStack_360 = 0;
  uStack_358 = 0;
  __stream = fopen64("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem opening /proc/cpuinfo",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    goto LAB_00134215;
  }
  iVar7 = feof(__stream);
  cVar13 = -2;
  if (iVar7 == 0) {
    do {
      fgetc(__stream);
      std::__cxx11::string::push_back((char)&puStack_368);
      iVar7 = feof(__stream);
      cVar13 = cVar13 + '\x01';
    } while (iVar7 == 0);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&puStack_368,cVar13);
  lVar9 = std::__cxx11::string::find((char *)&puStack_368,0x13f797,0);
  if (lVar9 != -1) {
    do {
      this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
      lVar9 = std::__cxx11::string::find((char *)&puStack_368,0x13f797,lVar9 + 1);
    } while (lVar9 != -1);
  }
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_60._M_impl.super__Rb_tree_header._M_header;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  sStack_c0._M_dataplus._M_p = (pointer)&sStack_c0.field_2;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_c0,puStack_368,puStack_368 + lStack_360);
  ExtractValueFromCpuInfoFile(&sStack_a0,this,&sStack_c0,"physical id",0);
  pFStack_288 = __stream;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_c0._M_dataplus._M_p != &sStack_c0.field_2) {
    operator_delete(sStack_c0._M_dataplus._M_p,sStack_c0.field_2._M_allocated_capacity + 1);
  }
  pSStack_310 = this;
  if (this->CurrentPositionInFile != 0xffffffffffffffff) {
    do {
      sStack_2e8._M_dataplus._M_p._0_4_ = atoi(sStack_a0._M_dataplus._M_p);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &_Stack_60,(int *)&sStack_2e8);
      sStack_e0._M_dataplus._M_p = (pointer)&sStack_e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_e0,puStack_368,puStack_368 + lStack_360);
      ExtractValueFromCpuInfoFile
                (&sStack_2c8,pSStack_310,&sStack_e0,"physical id",
                 pSStack_310->CurrentPositionInFile + 1);
      std::__cxx11::string::operator=((string *)&sStack_a0,(string *)&sStack_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_2c8._M_dataplus._M_p != &sStack_2c8.field_2) {
        operator_delete(sStack_2c8._M_dataplus._M_p,sStack_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_e0._M_dataplus._M_p != &sStack_e0.field_2) {
        operator_delete(sStack_e0._M_dataplus._M_p,sStack_e0.field_2._M_allocated_capacity + 1);
      }
    } while (pSStack_310->CurrentPositionInFile != 0xffffffffffffffff);
  }
  bVar16 = _Stack_60._M_impl.super__Rb_tree_header._M_node_count == 0;
  iVar7 = (int)_Stack_60._M_impl.super__Rb_tree_header._M_node_count;
  sStack_100._M_dataplus._M_p = (pointer)&sStack_100.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_100,puStack_368,puStack_368 + lStack_360);
  pSVar6 = pSStack_310;
  ExtractValueFromCpuInfoFile(&sStack_2c8,pSStack_310,&sStack_100,"cpu cores",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_100._M_dataplus._M_p != &sStack_100.field_2) {
    operator_delete(sStack_100._M_dataplus._M_p,sStack_100.field_2._M_allocated_capacity + 1);
  }
  iVar8 = atoi(sStack_2c8._M_dataplus._M_p);
  iVar7 = (iVar7 + (uint)bVar16) * (iVar8 + (uint)(iVar8 == 0));
  uVar14 = iVar7 + (uint)(iVar7 == 0);
  pSVar6->NumberOfPhysicalCPU = uVar14;
  (pSVar6->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
       pSVar6->NumberOfLogicalCPU / uVar14;
  sStack_120._M_dataplus._M_p = (pointer)&sStack_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_120,puStack_368,puStack_368 + lStack_360);
  ExtractValueFromCpuInfoFile(&sStack_2e8,pSVar6,&sStack_120,"cpu MHz",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_120._M_dataplus._M_p != &sStack_120.field_2) {
    operator_delete(sStack_120._M_dataplus._M_p,sStack_120.field_2._M_allocated_capacity + 1);
  }
  if (sStack_2e8._M_string_length == 0) {
    sStack_140._M_dataplus._M_p = (pointer)&sStack_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_140,puStack_368,puStack_368 + lStack_360);
    ExtractValueFromCpuInfoFile(&sStack_308,pSVar6,&sStack_140,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&sStack_2e8,(string *)&sStack_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_308._M_dataplus._M_p != &sStack_308.field_2) {
      operator_delete(sStack_308._M_dataplus._M_p,sStack_308.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_140._M_dataplus._M_p != &sStack_140.field_2) {
      operator_delete(sStack_140._M_dataplus._M_p,sStack_140.field_2._M_allocated_capacity + 1);
    }
    uVar10 = strtoull((char *)CONCAT44(sStack_2e8._M_dataplus._M_p._4_4_,
                                       (int)sStack_2e8._M_dataplus._M_p),(char **)0x0,0x10);
    fVar17 = (float)uVar10 / 1e+06;
  }
  else {
    dVar4 = atof((char *)CONCAT44(sStack_2e8._M_dataplus._M_p._4_4_,(int)sStack_2e8._M_dataplus._M_p
                                 ));
    fVar17 = (float)dVar4;
  }
  pSVar6->CPUSpeedInMHz = fVar17;
  sStack_160._M_dataplus._M_p = (pointer)&sStack_160.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_160,puStack_368,puStack_368 + lStack_360);
  ExtractValueFromCpuInfoFile(&sStack_308,pSVar6,&sStack_160,"cpu family",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_160._M_dataplus._M_p != &sStack_160.field_2) {
    operator_delete(sStack_160._M_dataplus._M_p,sStack_160.field_2._M_allocated_capacity + 1);
  }
  if (sStack_308._M_string_length == 0) {
    sStack_180._M_dataplus._M_p = (pointer)&sStack_180.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_180,puStack_368,puStack_368 + lStack_360);
    ExtractValueFromCpuInfoFile(&sStack_330,pSVar6,&sStack_180,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&sStack_308,(string *)&sStack_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_330._M_dataplus._M_p != &sStack_330.field_2) {
      operator_delete(sStack_330._M_dataplus._M_p,sStack_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_180._M_dataplus._M_p != &sStack_180.field_2) {
      operator_delete(sStack_180._M_dataplus._M_p,sStack_180.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(sStack_308._M_dataplus._M_p);
  (pSVar6->ChipID).Family = iVar7;
  sStack_1a0._M_dataplus._M_p = (pointer)&sStack_1a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_1a0,puStack_368,puStack_368 + lStack_360);
  ExtractValueFromCpuInfoFile(&sStack_330,pSVar6,&sStack_1a0,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(pSVar6->ChipID).Vendor,(string *)&sStack_330);
  paVar2 = &sStack_330.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_330._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_330._M_dataplus._M_p,sStack_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1a0._M_dataplus._M_p != &sStack_1a0.field_2) {
    operator_delete(sStack_1a0._M_dataplus._M_p,sStack_1a0.field_2._M_allocated_capacity + 1);
  }
  FindManufacturer(pSVar6,&sStack_308);
  if (((pSVar6->ChipID).Family == 0) && (pSVar6->ChipManufacturer == HP)) {
    iVar7 = std::__cxx11::string::compare((char *)&sStack_308);
    if (iVar7 == 0) {
      iVar7 = 0x11a;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&sStack_308);
      if (iVar7 != 0) goto LAB_001339eb;
      iVar7 = 0x200;
    }
    (pSVar6->ChipID).Family = iVar7;
  }
LAB_001339eb:
  sStack_1c0._M_dataplus._M_p = (pointer)&sStack_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_1c0,puStack_368,puStack_368 + lStack_360);
  ExtractValueFromCpuInfoFile(&sStack_330,pSVar6,&sStack_1c0,"model",0);
  _Var5._M_p = sStack_330._M_dataplus._M_p;
  iVar7 = atoi(sStack_330._M_dataplus._M_p);
  (pSVar6->ChipID).Model = iVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar2) {
    operator_delete(_Var5._M_p,sStack_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1c0._M_dataplus._M_p != &sStack_1c0.field_2) {
    operator_delete(sStack_1c0._M_dataplus._M_p,sStack_1c0.field_2._M_allocated_capacity + 1);
  }
  bVar16 = RetrieveClassicalCPUIdentity(pSVar6);
  if (!bVar16) {
    sStack_1e0._M_dataplus._M_p = (pointer)&sStack_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_1e0,puStack_368,puStack_368 + lStack_360);
    ExtractValueFromCpuInfoFile(&sStack_330,pSVar6,&sStack_1e0,"cpu",0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_1e0._M_dataplus._M_p != &sStack_1e0.field_2) {
      operator_delete(sStack_1e0._M_dataplus._M_p,sStack_1e0.field_2._M_allocated_capacity + 1);
    }
    if (sStack_330._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(pSVar6->ChipID).ProcessorName);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_330._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_330._M_dataplus._M_p,sStack_330.field_2._M_allocated_capacity + 1);
    }
  }
  sStack_200._M_dataplus._M_p = (pointer)&sStack_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_200,puStack_368,puStack_368 + lStack_360);
  ExtractValueFromCpuInfoFile(&sStack_330,pSVar6,&sStack_200,"stepping",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_200._M_dataplus._M_p != &sStack_200.field_2) {
    operator_delete(sStack_200._M_dataplus._M_p,sStack_200.field_2._M_allocated_capacity + 1);
  }
  if (sStack_330._M_string_length == 0) {
    sStack_220._M_dataplus._M_p = (pointer)&sStack_220.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_220,puStack_368,puStack_368 + lStack_360);
    ExtractValueFromCpuInfoFile(&sStack_388,pSVar6,&sStack_220,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&sStack_330,(string *)&sStack_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_388._M_dataplus._M_p != &sStack_388.field_2) {
      operator_delete(sStack_388._M_dataplus._M_p,sStack_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_220._M_dataplus._M_p != &sStack_220.field_2) {
      operator_delete(sStack_220._M_dataplus._M_p,sStack_220.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(sStack_330._M_dataplus._M_p);
  (pSVar6->ChipID).Revision = iVar7;
  sStack_240._M_dataplus._M_p = (pointer)&sStack_240.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_240,puStack_368,puStack_368 + lStack_360);
  ExtractValueFromCpuInfoFile(&sStack_388,pSVar6,&sStack_240,"model name",0);
  _Var5._M_p = sStack_388._M_dataplus._M_p;
  pcVar3 = (char *)(pSVar6->ChipID).ModelName._M_string_length;
  strlen(sStack_388._M_dataplus._M_p);
  std::__cxx11::string::_M_replace((ulong)&(pSVar6->ChipID).ModelName,0,pcVar3,(ulong)_Var5._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_388._M_dataplus._M_p != &sStack_388.field_2) {
    operator_delete(sStack_388._M_dataplus._M_p,sStack_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_240._M_dataplus._M_p != &sStack_240.field_2) {
    operator_delete(sStack_240._M_dataplus._M_p,sStack_240.field_2._M_allocated_capacity + 1);
  }
  ppcStack_348 = (char **)0x0;
  ppcStack_338 = (char **)0x0;
  iStack_340._M_current = (char **)0x0;
  sStack_388._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&ppcStack_348,(iterator)0x0,
             (char **)&sStack_388);
  sStack_388._M_dataplus._M_p = "I-cache";
  if (iStack_340._M_current == ppcStack_338) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&ppcStack_348,iStack_340,
               (char **)&sStack_388);
  }
  else {
    *iStack_340._M_current = "I-cache";
    iStack_340._M_current = iStack_340._M_current + 1;
  }
  sStack_388._M_dataplus._M_p = "D-cache";
  if (iStack_340._M_current == ppcStack_338) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&ppcStack_348,iStack_340,
               (char **)&sStack_388);
  }
  else {
    *iStack_340._M_current = "D-cache";
    iStack_340._M_current = iStack_340._M_current + 1;
  }
  (pSVar6->Features).L1CacheSize = 0;
  if (iStack_340._M_current != ppcStack_348) {
    uVar15 = 0;
    do {
      sStack_260._M_dataplus._M_p = (pointer)&sStack_260.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_260,puStack_368,puStack_368 + lStack_360);
      ExtractValueFromCpuInfoFile(&sStack_388,pSStack_310,&sStack_260,ppcStack_348[uVar15],0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_260._M_dataplus._M_p != &sStack_260.field_2) {
        operator_delete(sStack_260._M_dataplus._M_p,sStack_260.field_2._M_allocated_capacity + 1);
      }
      if (sStack_388._M_string_length != 0) {
        lVar9 = std::__cxx11::string::find((char *)&sStack_388,0x13f850,0);
        if (lVar9 != -1) {
          std::__cxx11::string::substr((ulong)&plStack_2a8,(ulong)&sStack_388);
          std::__cxx11::string::operator=((string *)&sStack_388,(string *)&plStack_2a8);
          if (plStack_2a8 != &lStack_298) {
            operator_delete(plStack_2a8,lStack_298 + 1);
          }
        }
        iVar7 = atoi(sStack_388._M_dataplus._M_p);
        piVar1 = &(pSStack_310->Features).L1CacheSize;
        *piVar1 = *piVar1 + iVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_388._M_dataplus._M_p != &sStack_388.field_2) {
        operator_delete(sStack_388._M_dataplus._M_p,sStack_388.field_2._M_allocated_capacity + 1);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)iStack_340._M_current - (long)ppcStack_348 >> 3));
  }
  sStack_280._M_dataplus._M_p = (pointer)&sStack_280.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_280,puStack_368,puStack_368 + lStack_360);
  pSVar6 = pSStack_310;
  ExtractValueFromCpuInfoFile(&sStack_388,pSStack_310,&sStack_280,"flags",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_280._M_dataplus._M_p != &sStack_280.field_2) {
    operator_delete(sStack_280._M_dataplus._M_p,sStack_280.field_2._M_allocated_capacity + 1);
  }
  if (sStack_330._M_string_length != 0) {
    std::operator+(&bStack_80," ",&sStack_388);
    plVar11 = (long *)std::__cxx11::string::append((char *)&bStack_80);
    plVar12 = plVar11 + 2;
    if ((long *)*plVar11 == plVar12) {
      lStack_298 = *plVar12;
      lStack_290 = plVar11[3];
      plStack_2a8 = &lStack_298;
    }
    else {
      lStack_298 = *plVar12;
      plStack_2a8 = (long *)*plVar11;
    }
    lStack_2a0 = plVar11[1];
    *plVar11 = (long)plVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&sStack_388,(string *)&plStack_2a8);
    if (plStack_2a8 != &lStack_298) {
      operator_delete(plStack_2a8,lStack_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bStack_80._M_dataplus._M_p != &bStack_80.field_2) {
      operator_delete(bStack_80._M_dataplus._M_p,bStack_80.field_2._M_allocated_capacity + 1);
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_388,0x13f85a,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasFPU = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_388,0x13f860,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasTSC = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_388,0x13f866,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasMMX = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_388,0x13f86c,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasSSE = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_388,0x13f872,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasSSE2 = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_388,0x13f879,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasAPIC = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_388,0x13f880,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasCMOV = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_388,0x13f887,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasMTRR = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_388,0x13f88e,0);
    if (lVar9 != -1) {
      (pSVar6->Features).HasACPI = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_388,0x13f895,0);
    if (lVar9 != -1) {
      (pSVar6->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_388._M_dataplus._M_p != &sStack_388.field_2) {
    operator_delete(sStack_388._M_dataplus._M_p,sStack_388.field_2._M_allocated_capacity + 1);
  }
  if (ppcStack_348 != (char **)0x0) {
    operator_delete(ppcStack_348,(long)ppcStack_338 - (long)ppcStack_348);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_330._M_dataplus._M_p != &sStack_330.field_2) {
    operator_delete(sStack_330._M_dataplus._M_p,sStack_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_308._M_dataplus._M_p != &sStack_308.field_2) {
    operator_delete(sStack_308._M_dataplus._M_p,sStack_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(sStack_2e8._M_dataplus._M_p._4_4_,(int)sStack_2e8._M_dataplus._M_p) !=
      &sStack_2e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(sStack_2e8._M_dataplus._M_p._4_4_,(int)sStack_2e8._M_dataplus._M_p),
                    sStack_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2c8._M_dataplus._M_p != &sStack_2c8.field_2) {
    operator_delete(sStack_2c8._M_dataplus._M_p,sStack_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_a0._M_dataplus._M_p != &sStack_a0.field_2) {
    operator_delete(sStack_a0._M_dataplus._M_p,sStack_a0.field_2._M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&_Stack_60);
LAB_00134215:
  if (puStack_368 != &uStack_358) {
    operator_delete(puStack_368,CONCAT71(uStack_357,uStack_358) + 1);
  }
  return;
}

Assistant:

void SystemInformationImplementation::RunCPUCheck()
{
#ifdef _WIN32
  // Check to see if this processor supports CPUID.
  bool supportsCPUID = DoesCPUSupportCPUID();

  if (supportsCPUID) {
    // Retrieve the CPU details.
    RetrieveCPUIdentity();
    this->FindManufacturer();
    RetrieveCPUFeatures();
  }

  // These two may be called without support for the CPUID instruction.
  // (But if the instruction is there, they should be called *after*
  // the above call to RetrieveCPUIdentity... that's why the two if
  // blocks exist with the same "if (supportsCPUID)" logic...
  //
  if (!RetrieveCPUClockSpeed()) {
    RetrieveClassicalCPUClockSpeed();
  }

  if (supportsCPUID) {
    // Retrieve cache information.
    if (!RetrieveCPUCacheDetails()) {
      RetrieveClassicalCPUCacheDetails();
    }

    // Retrieve the extended CPU details.
    if (!RetrieveExtendedCPUIdentity()) {
      RetrieveClassicalCPUIdentity();
    }

    RetrieveExtendedCPUFeatures();
    RetrieveCPUPowerManagement();

    // Now attempt to retrieve the serial number (if possible).
    RetrieveProcessorSerialNumber();
  }

  this->CPUCountWindows();

#elif defined(__APPLE__)
  this->ParseSysCtl();
#elif defined(__SVR4) && defined(__sun)
  this->QuerySolarisProcessor();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXProcessor();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) ||  \
  defined(__DragonFly__)
  this->QueryBSDProcessor();
#elif defined(__hpux)
  this->QueryHPUXProcessor();
#elif defined(__linux) || defined(__CYGWIN__)
  this->RetreiveInformationFromCpuInfoFile();
#else
  this->QueryProcessor();
#endif
}